

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gfxwrapper_opengl.c
# Opt level: O0

_Bool ksGpuWindow_Create(ksGpuWindow *window,ksDriverInstance *instance,ksGpuQueueInfo *queueInfo,
                        int queueIndex,ksGpuSurfaceColorFormat colorFormat,
                        ksGpuSurfaceDepthFormat depthFormat,ksGpuSampleCount sampleCount,int width,
                        int height,_Bool fullscreen)

{
  int iVar1;
  Display *pDVar2;
  Window WVar3;
  XVisualInfo *pXVar4;
  Colormap CVar5;
  ulong uVar6;
  undefined8 *puVar7;
  float *desiredRefreshRate;
  undefined4 uVar9;
  undefined8 uVar8;
  undefined8 in_stack_fffffffffffffe88;
  undefined4 uVar10;
  int y;
  int x;
  XSizeHints *hints;
  XSetWindowAttributes attributes;
  Atom _NET_WM_BYPASS_COMPOSITOR;
  unsigned_long bypass;
  Atom _NET_WM_NAME;
  XSetWindowAttributes wa;
  unsigned_long wamask;
  char *displayName;
  _Bool fullscreen_local;
  ksGpuSurfaceDepthFormat depthFormat_local;
  ksGpuSurfaceColorFormat colorFormat_local;
  int queueIndex_local;
  ksGpuQueueInfo *queueInfo_local;
  ksDriverInstance *instance_local;
  ksGpuWindow *window_local;
  
  uVar10 = (undefined4)((ulong)in_stack_fffffffffffffe88 >> 0x20);
  memset(window,0,0x228);
  window->colorFormat = colorFormat;
  window->depthFormat = depthFormat;
  window->sampleCount = sampleCount;
  window->windowWidth = width;
  window->windowHeight = height;
  window->windowSwapInterval = 1;
  window->windowRefreshRate = 60.0;
  window->windowFullscreen = fullscreen;
  window->windowActive = false;
  window->windowExit = false;
  pDVar2 = (Display *)XOpenDisplay(0);
  window->xDisplay = pDVar2;
  if (window->xDisplay == (Display *)0x0) {
    Error("Unable to open X Display.");
    window_local._7_1_ = false;
  }
  else {
    iVar1 = XDefaultScreen(window->xDisplay);
    window->xScreen = iVar1;
    WVar3 = XRootWindow(window->xDisplay,window->xScreen);
    window->xRoot = WVar3;
    if ((window->windowFullscreen & 1U) == 0) {
      uVar9 = 0;
      ChangeVideoMode_XF86VidMode
                (window->xDisplay,window->xScreen,&window->desktopWidth,&window->desktopHeight,
                 &window->desktopRefreshRate,(int *)0x0,(int *)0x0,(float *)0x0);
      window->windowRefreshRate = window->desktopRefreshRate;
    }
    else {
      desiredRefreshRate = &window->windowRefreshRate;
      ChangeVideoMode_XF86VidMode
                (window->xDisplay,window->xScreen,&window->desktopWidth,&window->desktopHeight,
                 &window->desktopRefreshRate,&window->windowWidth,&window->windowHeight,
                 desiredRefreshRate);
      uVar9 = (undefined4)((ulong)desiredRefreshRate >> 0x20);
    }
    ksGpuDevice_Create(&window->device,instance,queueInfo);
    pDVar2 = window->xDisplay;
    ksGpuContext_CreateForSurface
              (&window->context,&window->device,queueIndex,colorFormat,depthFormat,sampleCount,
               pDVar2,window->xScreen);
    pXVar4 = (XVisualInfo *)glXGetVisualFromFBConfig(window->xDisplay,(window->context).glxFBConfig)
    ;
    window->xVisual = pXVar4;
    if (window->xVisual == (XVisualInfo *)0x0) {
      Error("Failed to retrieve visual for framebuffer config.");
      ksGpuWindow_Destroy(window);
      window_local._7_1_ = false;
    }
    else {
      CVar5 = XCreateColormap(window->xDisplay,window->xRoot,window->xVisual->visual,0);
      window->xColormap = CVar5;
      uVar6 = 8;
      if ((window->windowFullscreen & 1U) != 0) {
        uVar6 = 0;
      }
      wa.cursor = uVar6 | 0x2800;
      memset(&_NET_WM_NAME,0,0x70);
      wa._88_8_ = window->xColormap;
      wa.border_pixmap = 0;
      wa.save_under = 0x67803f;
      wa._68_4_ = 0;
      uVar8 = CONCAT44(uVar9,window->xVisual->depth);
      WVar3 = XCreateWindow(window->xDisplay,window->xRoot,0,0,window->windowWidth,
                            window->windowHeight,(ulong)pDVar2 & 0xffffffff00000000,uVar8,
                            CONCAT44(uVar10,1),window->xVisual->visual,wa.cursor,&_NET_WM_NAME);
      uVar10 = (undefined4)((ulong)uVar8 >> 0x20);
      window->xWindow = WVar3;
      if (window->xWindow == 0) {
        Error("Failed to create window.");
        ksGpuWindow_Destroy(window);
        window_local._7_1_ = false;
      }
      else {
        bypass = XInternAtom(window->xDisplay,"_NET_WM_NAME",0);
        uVar8 = CONCAT44(uVar10,9);
        XChangeProperty(window->xDisplay,window->xWindow,bypass,0x1f,8,0,"OpenGL SI",uVar8);
        uVar10 = (undefined4)((ulong)uVar8 >> 0x20);
        if ((window->windowFullscreen & 1U) == 0) {
          puVar7 = (undefined8 *)XAllocSizeHints();
          *puVar7 = 0x30;
          *(int *)(puVar7 + 3) = window->windowWidth;
          *(int *)(puVar7 + 4) = window->windowWidth;
          *(int *)((long)puVar7 + 0x1c) = window->windowHeight;
          *(int *)((long)puVar7 + 0x24) = window->windowHeight;
          XSetWMNormalHints(window->xDisplay,window->xWindow,puVar7);
          XFree(puVar7);
          XMapRaised(window->xDisplay,window->xWindow);
          XMoveResizeWindow(window->xDisplay,window->xWindow,
                            (window->desktopWidth - window->windowWidth) / 2,
                            (window->desktopHeight - window->windowHeight) / 2,window->windowWidth,
                            window->windowHeight);
          XFlush(window->xDisplay);
        }
        else {
          _NET_WM_BYPASS_COMPOSITOR = 1;
          attributes.cursor = XInternAtom(window->xDisplay,"_NET_WM_BYPASS_COMPOSITOR",0);
          XChangeProperty(window->xDisplay,window->xWindow,attributes.cursor,6,0x20,0,
                          &_NET_WM_BYPASS_COMPOSITOR,CONCAT44(uVar10,1));
          attributes.do_not_propagate_mask._0_4_ = 1;
          XChangeWindowAttributes(window->xDisplay,window->xWindow,0x200,&hints);
          XMapRaised(window->xDisplay,window->xWindow);
          XMoveResizeWindow(window->xDisplay,window->xWindow,0,0,window->windowWidth,
                            window->windowHeight);
          XFlush(window->xDisplay);
          XGrabPointer(window->xDisplay,window->xWindow,1,0,1,1,window->xWindow,0,0);
          XGrabKeyboard(window->xDisplay,window->xWindow,1,1,1,0);
        }
        (window->context).glxDrawable = window->xWindow;
        ksGpuContext_SetCurrent(&window->context);
        window_local._7_1_ = true;
      }
    }
  }
  return window_local._7_1_;
}

Assistant:

bool ksGpuWindow_Create(ksGpuWindow *window, ksDriverInstance *instance, const ksGpuQueueInfo *queueInfo, const int queueIndex,
                        const ksGpuSurfaceColorFormat colorFormat, const ksGpuSurfaceDepthFormat depthFormat,
                        const ksGpuSampleCount sampleCount, const int width, const int height, const bool fullscreen) {
    memset(window, 0, sizeof(ksGpuWindow));

    window->colorFormat = colorFormat;
    window->depthFormat = depthFormat;
    window->sampleCount = sampleCount;
    window->windowWidth = width;
    window->windowHeight = height;
    window->windowSwapInterval = 1;
    window->windowRefreshRate = 60.0f;
    window->windowFullscreen = fullscreen;
    window->windowActive = false;
    window->windowExit = false;

    const char *displayName = NULL;
    window->xDisplay = XOpenDisplay(displayName);
    if (!window->xDisplay) {
        Error("Unable to open X Display.");
        return false;
    }

    window->xScreen = XDefaultScreen(window->xDisplay);
    window->xRoot = XRootWindow(window->xDisplay, window->xScreen);

    if (window->windowFullscreen) {
        ChangeVideoMode_XF86VidMode(window->xDisplay, window->xScreen, &window->desktopWidth, &window->desktopHeight,
                                    &window->desktopRefreshRate, &window->windowWidth, &window->windowHeight,
                                    &window->windowRefreshRate);
    } else {
        ChangeVideoMode_XF86VidMode(window->xDisplay, window->xScreen, &window->desktopWidth, &window->desktopHeight,
                                    &window->desktopRefreshRate, NULL, NULL, NULL);
        window->windowRefreshRate = window->desktopRefreshRate;
    }

    ksGpuDevice_Create(&window->device, instance, queueInfo);
    ksGpuContext_CreateForSurface(&window->context, &window->device, queueIndex, colorFormat, depthFormat, sampleCount,
                                  window->xDisplay, window->xScreen);

    window->xVisual = glXGetVisualFromFBConfig(window->xDisplay, window->context.glxFBConfig);
    if (window->xVisual == NULL) {
        Error("Failed to retrieve visual for framebuffer config.");
        ksGpuWindow_Destroy(window);
        return false;
    }

    window->xColormap = XCreateColormap(window->xDisplay, window->xRoot, window->xVisual->visual, AllocNone);

    const unsigned long wamask = CWColormap | CWEventMask | (window->windowFullscreen ? 0 : CWBorderPixel);

    XSetWindowAttributes wa;
    memset(&wa, 0, sizeof(wa));
    wa.colormap = window->xColormap;
    wa.border_pixel = 0;
    wa.event_mask = StructureNotifyMask | PropertyChangeMask | ResizeRedirectMask | KeyPressMask | KeyReleaseMask |
                    ButtonPressMask | ButtonReleaseMask | FocusChangeMask | ExposureMask | VisibilityChangeMask | EnterWindowMask |
                    LeaveWindowMask;

    window->xWindow = XCreateWindow(window->xDisplay,         // Display * display
                                    window->xRoot,            // Window parent
                                    0,                        // int x
                                    0,                        // int y
                                    window->windowWidth,      // unsigned int width
                                    window->windowHeight,     // unsigned int height
                                    0,                        // unsigned int border_width
                                    window->xVisual->depth,   // int depth
                                    InputOutput,              // unsigned int class
                                    window->xVisual->visual,  // Visual * visual
                                    wamask,                   // unsigned long valuemask
                                    &wa);                     // XSetWindowAttributes * attributes

    if (!window->xWindow) {
        Error("Failed to create window.");
        ksGpuWindow_Destroy(window);
        return false;
    }

    // Change the window title.
    Atom _NET_WM_NAME = XInternAtom(window->xDisplay, "_NET_WM_NAME", False);
    XChangeProperty(window->xDisplay, window->xWindow, _NET_WM_NAME, XA_STRING, 8, PropModeReplace,
                    (const unsigned char *)WINDOW_TITLE, strlen(WINDOW_TITLE));

    if (window->windowFullscreen) {
        // Bypass the compositor in fullscreen mode.
        const unsigned long bypass = 1;
        Atom _NET_WM_BYPASS_COMPOSITOR = XInternAtom(window->xDisplay, "_NET_WM_BYPASS_COMPOSITOR", False);
        XChangeProperty(window->xDisplay, window->xWindow, _NET_WM_BYPASS_COMPOSITOR, XA_CARDINAL, 32, PropModeReplace,
                        (const unsigned char *)&bypass, 1);

        // Completely disassociate window from window manager.
        XSetWindowAttributes attributes;
        attributes.override_redirect = True;
        XChangeWindowAttributes(window->xDisplay, window->xWindow, CWOverrideRedirect, &attributes);

        // Make the window visible.
        XMapRaised(window->xDisplay, window->xWindow);
        XMoveResizeWindow(window->xDisplay, window->xWindow, 0, 0, window->windowWidth, window->windowHeight);
        XFlush(window->xDisplay);

        // Grab mouse and keyboard input now that the window is disassociated from the window manager.
        XGrabPointer(window->xDisplay, window->xWindow, True, 0, GrabModeAsync, GrabModeAsync, window->xWindow, 0L, CurrentTime);
        XGrabKeyboard(window->xDisplay, window->xWindow, True, GrabModeAsync, GrabModeAsync, CurrentTime);
    } else {
        // Make the window fixed size.
        XSizeHints *hints = XAllocSizeHints();
        hints->flags = (PMinSize | PMaxSize);
        hints->min_width = window->windowWidth;
        hints->max_width = window->windowWidth;
        hints->min_height = window->windowHeight;
        hints->max_height = window->windowHeight;
        XSetWMNormalHints(window->xDisplay, window->xWindow, hints);
        XFree(hints);

        // First map the window and then center the window on the screen.
        XMapRaised(window->xDisplay, window->xWindow);
        const int x = (window->desktopWidth - window->windowWidth) / 2;
        const int y = (window->desktopHeight - window->windowHeight) / 2;
        XMoveResizeWindow(window->xDisplay, window->xWindow, x, y, window->windowWidth, window->windowHeight);
        XFlush(window->xDisplay);
    }

    window->context.glxDrawable = window->xWindow;

    ksGpuContext_SetCurrent(&window->context);

    return true;
}